

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_dict(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined8 uVar10;
  long lVar11;
  undefined8 uVar12;
  int test_ret_5;
  bool bVar13;
  uint uVar14;
  int n_len;
  uint uVar15;
  ulong uVar16;
  int test_ret;
  int test_ret_6;
  undefined8 *puVar17;
  int n_str;
  undefined4 *puVar18;
  int test_ret_1;
  int test_ret_4;
  int test_ret_3;
  uint local_50;
  uint local_4c;
  int local_48;
  uint local_44;
  
  if (quiet == '\0') {
    puts("Testing dict : 10 of 13 functions ...");
  }
  iVar2 = xmlMemBlocks();
  xmlDictCleanup();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar3 = xmlMemBlocks();
  if (iVar2 != iVar3) {
    iVar4 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlDictCleanup",(ulong)(uint)(iVar4 - iVar2));
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar4 = xmlMemBlocks();
  uVar10 = xmlDictCreate();
  xmlDictFree(uVar10);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar5 = xmlMemBlocks();
  if (iVar4 != iVar5) {
    iVar6 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlDictCreate",(ulong)(uint)(iVar6 - iVar4));
    putchar(10);
  }
  local_4c = (uint)(iVar4 != iVar5);
  function_tests = function_tests + 1;
  uVar14 = 0;
  iVar4 = 0;
  bVar1 = true;
  do {
    bVar13 = bVar1;
    iVar5 = xmlMemBlocks();
    if (bVar13) {
      lVar11 = xmlDictCreate();
    }
    else {
      lVar11 = 0;
    }
    uVar10 = xmlDictCreateSub(lVar11);
    xmlDictFree(uVar10);
    call_tests = call_tests + 1;
    if (lVar11 != 0) {
      xmlDictFree(lVar11);
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDictCreateSub",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      printf(" %d",(ulong)uVar14);
      putchar(10);
    }
    uVar14 = 1;
    bVar1 = false;
  } while (bVar13);
  function_tests = function_tests + 1;
  bVar1 = true;
  local_48 = 0;
  local_44 = 0;
  do {
    uVar14 = 0;
    do {
      puVar18 = &DAT_00158240;
      uVar16 = 0;
      do {
        iVar5 = xmlMemBlocks();
        if (bVar1) {
          lVar11 = xmlDictCreate();
        }
        else {
          lVar11 = 0;
        }
        if (uVar14 < 4) {
          iVar2 = (*(code *)(&DAT_0014c038 + *(int *)(&DAT_0014c038 + (ulong)uVar14 * 4)))();
          return iVar2;
        }
        xmlDictExists(lVar11,0,*puVar18);
        call_tests = call_tests + 1;
        if (lVar11 != 0) {
          xmlDictFree(lVar11);
        }
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDictExists",(ulong)(uint)(iVar6 - iVar5));
          local_48 = local_48 + 1;
          printf(" %d",(ulong)local_44);
          printf(" %d",(ulong)uVar14);
          printf(" %d",uVar16);
          putchar(10);
        }
        uVar15 = (int)uVar16 + 1;
        uVar16 = (ulong)uVar15;
        puVar18 = puVar18 + 1;
      } while (uVar15 != 4);
      uVar14 = uVar14 + 1;
    } while (uVar14 != 5);
    local_44 = 1;
    bVar13 = !bVar1;
    bVar1 = false;
    if (bVar13) {
      function_tests = function_tests + 1;
      iVar2 = local_4c + (iVar2 != iVar3) + iVar4 + local_48;
      bVar1 = true;
      local_48 = 0;
      local_44 = 0;
      do {
        uVar14 = 0;
        do {
          puVar18 = &DAT_00158240;
          uVar16 = 0;
          do {
            iVar3 = xmlMemBlocks();
            if (bVar1) {
              lVar11 = xmlDictCreate();
            }
            else {
              lVar11 = 0;
            }
            if (uVar14 < 4) {
              iVar2 = (*(code *)(&DAT_0014c048 + *(int *)(&DAT_0014c048 + (ulong)uVar14 * 4)))();
              return iVar2;
            }
            xmlDictLookup(lVar11,0,*puVar18);
            call_tests = call_tests + 1;
            if (lVar11 != 0) {
              xmlDictFree(lVar11);
            }
            xmlResetLastError();
            iVar4 = xmlMemBlocks();
            if (iVar3 != iVar4) {
              iVar4 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlDictLookup",(ulong)(uint)(iVar4 - iVar3));
              local_48 = local_48 + 1;
              printf(" %d",(ulong)local_44);
              printf(" %d",(ulong)uVar14);
              printf(" %d",uVar16);
              putchar(10);
            }
            uVar15 = (int)uVar16 + 1;
            uVar16 = (ulong)uVar15;
            puVar18 = puVar18 + 1;
          } while (uVar15 != 4);
          uVar14 = uVar14 + 1;
        } while (uVar14 != 5);
        local_44 = 1;
        bVar13 = !bVar1;
        bVar1 = false;
        if (bVar13) {
          function_tests = function_tests + 1;
          iVar3 = 0;
          uVar14 = 0;
          bVar1 = true;
          do {
            bVar13 = bVar1;
            uVar15 = 0;
            puVar17 = &DAT_0015ad60;
            do {
              iVar4 = xmlMemBlocks();
              if (bVar13) {
                lVar11 = xmlDictCreate();
              }
              else {
                lVar11 = 0;
              }
              if (uVar15 < 4) {
                uVar10 = *puVar17;
              }
              else {
                uVar10 = 0;
              }
              xmlDictOwns(lVar11,uVar10);
              call_tests = call_tests + 1;
              if (lVar11 != 0) {
                xmlDictFree(lVar11);
              }
              xmlResetLastError();
              iVar5 = xmlMemBlocks();
              if (iVar4 != iVar5) {
                iVar5 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlDictOwns",(ulong)(uint)(iVar5 - iVar4));
                iVar3 = iVar3 + 1;
                printf(" %d",(ulong)uVar14);
                printf(" %d");
                putchar(10);
              }
              uVar15 = uVar15 + 1;
              puVar17 = puVar17 + 1;
            } while (uVar15 != 5);
            uVar14 = 1;
            bVar1 = false;
          } while (bVar13);
          function_tests = function_tests + 1;
          iVar4 = 0;
          local_50 = 0;
          bVar1 = true;
          do {
            bVar13 = bVar1;
            uVar14 = 0;
            do {
              puVar17 = &DAT_0015ad60;
              uVar15 = 0;
              do {
                iVar5 = xmlMemBlocks();
                if (bVar13) {
                  lVar11 = xmlDictCreate();
                }
                else {
                  lVar11 = 0;
                }
                if (uVar14 < 4) {
                  uVar10 = (&DAT_0015ad60)[uVar14];
                }
                else {
                  uVar10 = 0;
                }
                if (uVar15 < 4) {
                  uVar12 = *puVar17;
                }
                else {
                  uVar12 = 0;
                }
                xmlDictQLookup(lVar11,uVar10,uVar12);
                call_tests = call_tests + 1;
                if (lVar11 != 0) {
                  xmlDictFree(lVar11);
                }
                xmlResetLastError();
                iVar6 = xmlMemBlocks();
                if (iVar5 != iVar6) {
                  iVar6 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlDictQLookup",(ulong)(uint)(iVar6 - iVar5));
                  iVar4 = iVar4 + 1;
                  printf(" %d",(ulong)local_50);
                  printf(" %d",(ulong)uVar14);
                  printf(" %d");
                  putchar(10);
                }
                uVar15 = uVar15 + 1;
                puVar17 = puVar17 + 1;
              } while (uVar15 != 5);
              uVar14 = uVar14 + 1;
            } while (uVar14 != 5);
            local_50 = 1;
            bVar1 = false;
          } while (bVar13);
          function_tests = function_tests + 1;
          uVar14 = 0;
          iVar5 = 0;
          bVar1 = true;
          do {
            bVar13 = bVar1;
            iVar6 = xmlMemBlocks();
            if (bVar13) {
              lVar11 = xmlDictCreate();
            }
            else {
              lVar11 = 0;
            }
            xmlDictReference(lVar11);
            xmlDictFree(lVar11);
            call_tests = call_tests + 1;
            if (lVar11 != 0) {
              xmlDictFree(lVar11);
            }
            xmlResetLastError();
            iVar7 = xmlMemBlocks();
            if (iVar6 != iVar7) {
              iVar7 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlDictReference",(ulong)(uint)(iVar7 - iVar6));
              iVar5 = iVar5 + 1;
              printf(" %d",(ulong)uVar14);
              putchar(10);
            }
            uVar14 = 1;
            bVar1 = false;
          } while (bVar13);
          function_tests = function_tests + 1;
          uVar14 = 0;
          iVar6 = 0;
          bVar1 = true;
          do {
            bVar13 = bVar1;
            iVar7 = xmlMemBlocks();
            if (bVar13) {
              lVar11 = xmlDictCreate();
            }
            else {
              lVar11 = 0;
            }
            xmlDictSize(lVar11);
            call_tests = call_tests + 1;
            if (lVar11 != 0) {
              xmlDictFree(lVar11);
            }
            xmlResetLastError();
            iVar8 = xmlMemBlocks();
            if (iVar7 != iVar8) {
              iVar8 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlDictSize",(ulong)(uint)(iVar8 - iVar7));
              iVar6 = iVar6 + 1;
              printf(" %d",(ulong)uVar14);
              putchar(10);
            }
            uVar14 = 1;
            bVar1 = false;
          } while (bVar13);
          function_tests = function_tests + 1;
          iVar7 = xmlMemBlocks();
          xmlInitializeDict();
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar8 = xmlMemBlocks();
          if (iVar7 != iVar8) {
            iVar9 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlInitializeDict",(ulong)(uint)(iVar9 - iVar7));
            putchar(10);
          }
          function_tests = function_tests + 1;
          uVar14 = iVar5 + iVar6 + iVar2 + local_48 + iVar3 + iVar4 + (uint)(iVar7 != iVar8);
          if (uVar14 != 0) {
            printf("Module dict: %d errors\n",(ulong)uVar14);
          }
          return uVar14;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

static int
test_dict(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing dict : 10 of 13 functions ...\n");
    test_ret += test_xmlDictCleanup();
    test_ret += test_xmlDictCreate();
    test_ret += test_xmlDictCreateSub();
    test_ret += test_xmlDictExists();
    test_ret += test_xmlDictGetUsage();
    test_ret += test_xmlDictLookup();
    test_ret += test_xmlDictOwns();
    test_ret += test_xmlDictQLookup();
    test_ret += test_xmlDictReference();
    test_ret += test_xmlDictSetLimit();
    test_ret += test_xmlDictSize();
    test_ret += test_xmlInitializeDict();

    if (test_ret != 0)
	printf("Module dict: %d errors\n", test_ret);
    return(test_ret);
}